

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O1

void __thiscall
SQCompilation::RenderVisitor::visitForStatement(RenderVisitor *this,ForStatement *loop)

{
  int iVar1;
  
  OutputStream::writeString(this->_out,"FOR (");
  if (loop->_init != (Node *)0x0) {
    Node::visit<SQCompilation::RenderVisitor>(loop->_init,this);
  }
  OutputStream::writeString(this->_out,"; ");
  if (&loop->_cond->super_Node != (Node *)0x0) {
    Node::visit<SQCompilation::RenderVisitor>(&loop->_cond->super_Node,this);
  }
  OutputStream::writeString(this->_out,"; ");
  if (&loop->_mod->super_Node != (Node *)0x0) {
    Node::visit<SQCompilation::RenderVisitor>(&loop->_mod->super_Node,this);
  }
  OutputStream::writeString(this->_out,")\n");
  this->_indent = this->_indent + 2;
  (*(this->super_Visitor)._vptr_Visitor[0x19])(this,loop);
  this->_indent = this->_indent + -2;
  OutputStream::writeChar(this->_out,'\n');
  iVar1 = (int)this->_indent;
  if (0 < iVar1) {
    do {
      OutputStream::writeInt8(this->_out,' ');
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  OutputStream::writeString(this->_out,"END_FOR");
  OutputStream::writeChar(this->_out,'\n');
  return;
}

Assistant:

virtual void visitForStatement(ForStatement *loop) {
      _out->writeString("FOR (");

        if (loop->initializer()) loop->initializer()->visit(this);
        _out->writeString("; ");

        if (loop->condition()) loop->condition()->visit(this);
        _out->writeString("; ");

        if (loop->modifier()) loop->modifier()->visit(this);
        _out->writeString(")\n");

        _indent += 2;
        visitLoopStatement(loop);
        _indent -= 2;

        newLine();

        indent(_indent);
        _out->writeString("END_FOR");
        newLine();
    }